

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O2

void mkundead(level *lev,coord *mm,boolean revive_corpses,int mm_flags)

{
  undefined1 *puVar1;
  xchar xVar2;
  boolean bVar3;
  int iVar4;
  permonst *mdat;
  obj *obj;
  monst *pmVar5;
  bool bVar6;
  coord cc;
  
  xVar2 = level_difficulty(&lev->z);
  iVar4 = rnd(5);
  iVar4 = iVar4 + (short)(xVar2 + 1) / 10;
  do {
    do {
      bVar6 = iVar4 == 0;
      iVar4 = iVar4 + -1;
      if (bVar6) {
        puVar1 = &(lev->flags).field_0xa;
        *puVar1 = *puVar1 | 1;
        return;
      }
      mdat = morguemon(&lev->z);
      bVar3 = enexto(&cc,lev,mm->x,mm->y,mdat);
    } while (bVar3 == '\0');
    if (revive_corpses == '\0') goto LAB_001d9390;
    obj = sobj_at(0x10e,lev,(int)cc.x,(int)cc.y);
    if (obj == (obj *)0x0) goto LAB_001d9390;
    pmVar5 = revive(obj);
    if (pmVar5 == (monst *)0x0) {
LAB_001d9390:
      makemon(mdat,lev,(int)cc.x,(int)cc.y,mm_flags);
    }
  } while( true );
}

Assistant:

void mkundead(struct level *lev, coord *mm, boolean revive_corpses, int mm_flags)
{
	int cnt = (level_difficulty(&lev->z) + 1)/10 + rnd(5);
	const struct permonst *mdat;
	struct obj *otmp;
	coord cc;

	while (cnt--) {
	    mdat = morguemon(&lev->z);
	    if (enexto(&cc, lev, mm->x, mm->y, mdat) &&
		    (!revive_corpses ||
		     !(otmp = sobj_at(CORPSE, lev, cc.x, cc.y)) ||
		     !revive(otmp)))
		makemon(mdat, lev, cc.x, cc.y, mm_flags);
	}
	lev->flags.graveyard = TRUE;	/* reduced chance for undead corpse */
}